

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RendererTests::RendererPopulatesBitmapWithMaskDataAccordingToOffset
          (RendererTests *this)

{
  allocator local_1a9;
  renderer r;
  bitmap<unsigned_char,_0UL,_0UL> bitmap1;
  blender<unsigned_char,_unsigned_char> blender1;
  string local_158;
  uint8_t reference [44];
  LocationInfo local_108;
  mask_full<8UL> mask1;
  cell cells3 [2];
  undefined1 local_a0 [8];
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  cell local_74;
  undefined1 local_68 [16];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  cell local_44;
  scanline_cells cells [3];
  
  cells[0].second = &local_44;
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  local_58 = 0;
  uStack_4c = 0;
  local_68._8_8_ = 0x300000011;
  uStack_54 = 0xfffffffd;
  uStack_50 = 7;
  local_48 = 0xfffffff2;
  cells[1].second = &local_74;
  local_88 = 0;
  uStack_7c = 0;
  local_98._0_4_ = 6;
  local_98._4_4_ = 0;
  local_98._8_8_ = 0x9000000ab;
  uStack_84 = 0xffffffe2;
  uStack_80 = 10;
  local_78 = 0xffffff73;
  cells[2].second = (cell *)local_a0;
  cells3[0].x = 1;
  cells3[0].area = 0;
  cells3[0].cover = 0xa0;
  cells3[1].x = 9;
  cells3[1].area = 0;
  cells3[1].cover = -0xa0;
  cells[0].first = (cell *)local_68;
  cells[1].first = (cell *)local_98;
  cells[2].first = cells3;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,3>
            ((mask<8ul> *)&mask1,&cells,3);
  mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap(&bitmap1,0xb,4);
  blender1.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  r._scanline_cache._buffer = (uint8_t *)0x0;
  blender1.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blender1.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  r._scanline_cache._size = 0;
  renderer::operator()
            (&r,&bitmap1,(vector_i)0x3ffffffff,(rect_i *)0x0,&mask1,&blender1,
             (simple_alpha<unsigned_char,_8UL> *)reference);
  reference[0x20] = '\0';
  reference[0x21] = '\0';
  reference[0x22] = '\0';
  reference[0x23] = '\0';
  reference[0x24] = '\0';
  reference[0x25] = '\0';
  reference[0x26] = '\0';
  reference[0x27] = '\0';
  reference[0x28] = '\0';
  reference[0x29] = '\0';
  reference[0x2a] = '\0';
  reference[0x2b] = '\0';
  reference[0x10] = '\0';
  reference[0x11] = '\0';
  reference[0x12] = 0xab;
  reference[0x13] = 0xab;
  reference[0x14] = 0xab;
  reference[0x15] = 0x8d;
  reference[0x16] = '\0';
  reference[0x17] = '\0';
  reference[0x18] = 0xa0;
  reference[0x19] = 0xa0;
  reference[0x1a] = 0xa0;
  reference[0x1b] = 0xa0;
  reference[0x1c] = 0xa0;
  reference[0x1d] = 0xa0;
  reference[0x1e] = 0xa0;
  reference[0x1f] = 0xa0;
  reference[0] = '\0';
  reference[1] = '\x11';
  reference[2] = '\x11';
  reference[3] = '\x11';
  reference[4] = '\x0e';
  reference[5] = '\x0e';
  reference[6] = '\x0e';
  reference[7] = '\x0e';
  reference[8] = '\0';
  reference[9] = '\0';
  reference[10] = '\0';
  reference[0xb] = '\0';
  reference[0xc] = '\0';
  reference[0xd] = '\0';
  reference[0xe] = '\0';
  reference[0xf] = '\0';
  std::__cxx11::string::string
            ((string *)&local_158,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_1a9);
  ut::LocationInfo::LocationInfo(&local_108,&local_158,0x48e);
  ut::are_equal<unsigned_char,44ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&reference,&bitmap1.data,&local_108);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  raw_memory_object::~raw_memory_object(&r._scanline_cache);
  std::
  _Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ::~_Vector_base((_Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                   *)&blender1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bitmap1);
  std::
  _Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
  ::~_Vector_base(&mask1.super_mask<8UL>._cells.
                   super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                 );
  return;
}

Assistant:

test( RendererPopulatesBitmapWithMaskDataAccordingToOffset )
			{
				// INIT
				const mocks::cell cells1[] = { { 0, 0, 0x11 }, { 3, 0, -0x03 }, { 7, 0, -0x0E }, };
				const mocks::cell cells2[] = { { 6, 0, 0xAB }, { 9, 0, -0x1E }, { 10, 0, -0x8D }, };
				const mocks::cell cells3[] = { { 1, 0, 0xA0 }, { 9, 0, -0xA0 }, };
				const mocks::mask<8>::scanline_cells cells[] = {
					make_pair(begin(cells1), end(cells1)),
					make_pair(begin(cells2), end(cells2)),
					make_pair(begin(cells3), end(cells3)),
				};
				const mocks::mask_full<8> mask1(cells, 3);
				mocks::bitmap<uint8_t> bitmap1(11, 4);
				mocks::blender<uint8_t, uint8_t> blender1;
				renderer r;

				// ACT
				r(bitmap1, mkvector(-1, 3), 0, mask1, blender1, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint8_t reference[] = {
					0x00, 0x11, 0x11, 0x11, 0x0E, 0x0E, 0x0E, 0x0E, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xAB, 0xAB, 0xAB, 0x8D,
					0x00, 0x00, 0xA0, 0xA0, 0xA0, 0xA0, 0xA0, 0xA0, 0xA0, 0xA0, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
				};

				assert_equal(reference, bitmap1.data);
			}